

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O3

int mriStep_Nls(ARKodeMem ark_mem,int nflag)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  long nls_fails_inc;
  long nls_iters_inc;
  long local_30;
  long local_28;
  
  local_28 = 0;
  local_30 = 0;
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    iVar5 = -0x15;
    arkProcessError(ark_mem,-0x15,"ARKode::MRIStep","mriStep_Nls","Time step module memory is NULL."
                   );
  }
  else {
    if (*(long *)((long)pvVar2 + 0x130) == 0) {
      *(undefined8 *)((long)pvVar2 + 0xe0) = 0x3ff0000000000000;
      bVar6 = false;
    }
    else {
      bVar6 = nflag == 6;
      if (*(int *)((long)pvVar2 + 0x10) == 0) {
        bVar6 = (nflag - 6U & 0xfffffffd) == 0;
      }
      *(uint *)((long)pvVar2 + 0x114) = (uint)(bVar6 ^ 1) * 2;
      bVar3 = true;
      if ((ark_mem->firststage == 0) && (-1 < *(int *)((long)pvVar2 + 0x100))) {
        dVar7 = ABS(*(double *)((long)pvVar2 + 0xb8) + -1.0);
        bVar3 = *(double *)((long)pvVar2 + 0xc0) <= dVar7 &&
                dVar7 != *(double *)((long)pvVar2 + 0xc0);
      }
      if (*(int *)((long)pvVar2 + 0x10) == 0) {
        bVar6 = true;
        if (!(bool)(nflag - 7U < 2 | bVar3)) {
          uVar1 = *(uint *)((long)pvVar2 + 0x100);
          uVar4 = -uVar1;
          if (0 < (int)uVar1) {
            uVar4 = uVar1;
          }
          bVar6 = (long)((ulong)uVar4 + *(long *)((long)pvVar2 + 0x108)) <= ark_mem->nst;
        }
      }
      else {
        bVar6 = true;
        if (!bVar3) {
          bVar6 = *(int *)((long)pvVar2 + 0x14) != 0;
        }
      }
    }
    N_VConst(0.0,*(N_Vector *)((long)pvVar2 + 0x80));
    *(double *)((long)pvVar2 + 0xf0) = *(double *)((long)pvVar2 + 0xf8) * 0.1;
    iVar5 = SUNNonlinSolSolve(*(SUNNonlinearSolver *)((long)pvVar2 + 0x90),
                              *(N_Vector *)((long)pvVar2 + 0x78),*(N_Vector *)((long)pvVar2 + 0x80),
                              ark_mem->ewt,*(double *)((long)pvVar2 + 0xf8),(uint)bVar6,ark_mem);
    SUNNonlinSolGetNumIters(*(SUNNonlinearSolver *)((long)pvVar2 + 0x90),&local_28);
    *(long *)((long)pvVar2 + 0x180) = *(long *)((long)pvVar2 + 0x180) + local_28;
    SUNNonlinSolGetNumConvFails(*(SUNNonlinearSolver *)((long)pvVar2 + 0x90),&local_30);
    *(long *)((long)pvVar2 + 0x188) = *(long *)((long)pvVar2 + 0x188) + local_30;
    if (iVar5 == 0x386) {
      iVar5 = 4;
    }
    else if (iVar5 == 0) {
      *(undefined4 *)((long)pvVar2 + 0x118) = 0;
      N_VLinearSum(1.0,*(N_Vector *)((long)pvVar2 + 0x80),1.0,*(N_Vector *)((long)pvVar2 + 0x78),
                   ark_mem->ycur);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int mriStep_Nls(ARKodeMem ark_mem, int nflag)
{
  ARKodeMRIStepMem step_mem;
  booleantype callLSetup;
  long int nls_iters_inc = 0;
  long int nls_fails_inc = 0;
  int retval;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_Nls", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* If a linear solver 'setup' is supplied, set various flags for
     determining whether it should be called */
  if (step_mem->lsetup) {

    /* Set interface 'convfail' flag for use inside lsetup */
    if (step_mem->linear) {
      step_mem->convfail = (nflag == FIRST_CALL) ? ARK_NO_FAILURES : ARK_FAIL_OTHER;
    } else {
      step_mem->convfail = ((nflag == FIRST_CALL) || (nflag == PREV_ERR_FAIL)) ?
        ARK_NO_FAILURES : ARK_FAIL_OTHER;
    }

    /* Decide whether to recommend call to lsetup within nonlinear solver */
    callLSetup = (ark_mem->firststage) || (step_mem->msbp < 0) ||
      (SUNRabs(step_mem->gamrat-ONE) > step_mem->dgmax);
    if (step_mem->linear) {   /* linearly-implicit problem */
      callLSetup = callLSetup || (step_mem->linear_timedep);
    } else {                  /* nonlinearly-implicit problem */
      callLSetup = callLSetup ||
        (nflag == PREV_CONV_FAIL) || (nflag == PREV_ERR_FAIL) ||
        (ark_mem->nst >= step_mem->nstlp + abs(step_mem->msbp));
    }
  } else {
    step_mem->crate = ONE;
    callLSetup = SUNFALSE;
  }

  /* set a zero guess for correction */
  N_VConst(ZERO, step_mem->zcor);

  /* Reset the stored residual norm (for iterative linear solvers) */
  step_mem->eRNrm = RCONST(0.1) * step_mem->nlscoef;

  /* solve the nonlinear system for the actual correction */
  retval = SUNNonlinSolSolve(step_mem->NLS, step_mem->zpred, step_mem->zcor,
                             ark_mem->ewt, step_mem->nlscoef, callLSetup, ark_mem);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    MRIStep nonlinear solution zcor:\n");
  N_VPrint(step_mem->zcor);
#endif

  /* increment counters */
  (void) SUNNonlinSolGetNumIters(step_mem->NLS, &nls_iters_inc);
  step_mem->nls_iters += nls_iters_inc;

  (void) SUNNonlinSolGetNumConvFails(step_mem->NLS, &nls_fails_inc);
  step_mem->nls_fails += nls_fails_inc;

  /* successful solve -- reset the jcur flag and apply correction */
  if (retval == SUN_NLS_SUCCESS) {
    step_mem->jcur = SUNFALSE;
    N_VLinearSum(ONE, step_mem->zcor, ONE, step_mem->zpred, ark_mem->ycur);
    return(ARK_SUCCESS);
  }

  /* check for recoverable failure, return ARKode::CONV_FAIL */
  if (retval == SUN_NLS_CONV_RECVR) return(CONV_FAIL);

  return(retval);
}